

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *qualifiedName,XMLCh *pubId,
          XMLCh *sysId,bool heap)

{
  DOMNode *pDVar1;
  code *pcVar2;
  short *psVar3;
  short *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  XMLMutexLock *target;
  DOMException *pDVar9;
  undefined4 extraout_var;
  long **pplVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar11;
  _func_int *p_Var12;
  undefined4 extraout_var_03;
  DOMNamedNodeMapImpl *pDVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar14;
  undefined8 *puVar15;
  long *plVar16;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar17;
  DOMNode *pDVar18;
  uint uVar19;
  _func_int **pp_Var20;
  long *plVar21;
  _func_int **pp_Var22;
  long lVar23;
  long lVar24;
  XMLCh XVar25;
  undefined8 *puVar26;
  _func_int *p_Var27;
  XMLCh temp [256];
  XMLMutexLock local_238 [65];
  undefined4 extraout_var_02;
  
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040fd08;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040fee8;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040ff18;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040ff48;
  pDVar1 = &ownerDoc->super_DOMNode;
  pDVar18 = pDVar1;
  if (ownerDoc == (DOMDocument *)0x0) {
    pDVar18 = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,pDVar18);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  *(undefined8 *)((long)&this->fSystemId + 1) = 0;
  *(undefined8 *)((long)&this->fInternalSubset + 1) = 0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fIsCreatedFromHeap = heap;
  uVar17 = 0;
  uVar8 = 0xffffffff;
  iVar7 = 0;
  do {
    if (qualifiedName[uVar17] == L':') {
      iVar7 = iVar7 + 1;
      uVar8 = uVar17 & 0xffffffff;
    }
    else if (qualifiedName[uVar17] == L'\0') break;
    uVar17 = uVar17 + 1;
  } while( true );
  uVar6 = (uint)uVar8;
  uVar19 = 0xffffffff;
  if (((uVar6 != 0 && (int)uVar17 != 0) && (iVar7 < 2 && (int)uVar17 - 1U != uVar6)) &&
     (uVar19 = 0, uVar6 != 0xffffffff)) {
    uVar19 = uVar6;
  }
  if ((int)uVar19 < 0) {
    pDVar9 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar7 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_06,iVar7) == 0) {
      pplVar10 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar7 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
      pplVar10 = (long **)(CONCAT44(extraout_var_08,iVar7) + 0x158);
    }
    DOMException::DOMException(pDVar9,0xe,0,(MemoryManager *)*pplVar10);
    __cxa_throw(pDVar9,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (uVar19 != 0) {
    if ((int)uVar19 < 0xff) {
      target = local_238;
    }
    else {
      if (qualifiedName == (XMLCh *)0x0) {
        lVar24 = 2;
      }
      else {
        lVar23 = 0;
        do {
          lVar24 = lVar23 + 2;
          psVar3 = (short *)((long)qualifiedName + lVar23);
          lVar23 = lVar24;
        } while (*psVar3 != 0);
      }
      target = (XMLMutexLock *)
               (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                         (XMLPlatformUtils::fgMemoryManager,lVar24);
    }
    uVar8 = (ulong)uVar19;
    XMLString::copyNString((XMLCh *)target,qualifiedName,uVar8);
    *(undefined2 *)((long)&target->fToLock + uVar8 * 2) = 0;
    if (ownerDoc == (DOMDocument *)0x0) {
      bVar5 = XMLChar1_0::isValidName((XMLCh *)target);
      if ((!bVar5) || (bVar5 = XMLChar1_0::isValidName(qualifiedName + uVar8 + 1), !bVar5)) {
        pDVar9 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar7 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var_07,iVar7) == 0) {
          pplVar10 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar7 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
          pplVar10 = (long **)(CONCAT44(extraout_var_10,iVar7) + 0x158);
        }
        DOMException::DOMException(pDVar9,0xe,0,(MemoryManager *)*pplVar10);
        goto LAB_002706ef;
      }
    }
    else {
      bVar5 = DOMDocumentImpl::isXMLName
                        ((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,(XMLCh *)target);
      if ((!bVar5) ||
         (bVar5 = DOMDocumentImpl::isXMLName
                            ((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,
                             qualifiedName + uVar8 + 1), !bVar5)) {
        pDVar9 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar7 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var,iVar7) == 0) {
          pplVar10 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar7 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
          pplVar10 = (long **)(CONCAT44(extraout_var_09,iVar7) + 0x158);
        }
        DOMException::DOMException(pDVar9,0xe,0,(MemoryManager *)*pplVar10);
LAB_002706ef:
        __cxa_throw(pDVar9,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    if (0xfe < (int)uVar19) {
      (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x20))
                (XMLPlatformUtils::fgMemoryManager,target);
    }
  }
  if (ownerDoc == (DOMDocument *)0x0) {
    XMLMutexLock::XMLMutexLock(local_238,sDocumentMutex);
    lVar24 = sDocument;
    plVar16 = (long *)(sDocument + -8);
    pXVar11 = (XMLCh *)(**(code **)(*(long *)(sDocument + -8) + 0x38))(plVar16,pubId);
    this->fPublicId = pXVar11;
    pXVar11 = (XMLCh *)(**(code **)(*plVar16 + 0x38))(plVar16,sysId);
    this->fSystemId = pXVar11;
    if (qualifiedName == (XMLCh *)0x0) {
      pXVar11 = (XMLCh *)0x0;
    }
    else {
      lVar23 = 0;
      do {
        psVar3 = (short *)((long)qualifiedName + lVar23);
        lVar23 = lVar23 + 2;
      } while (*psVar3 != 0);
      uVar8 = (ulong)(ushort)*qualifiedName;
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        XVar25 = qualifiedName[1];
        if (XVar25 != L'\0') {
          pXVar11 = qualifiedName + 2;
          do {
            uVar8 = (ulong)(ushort)XVar25 + (uVar8 >> 0x18) + uVar8 * 0x26;
            XVar25 = *pXVar11;
            pXVar11 = pXVar11 + 1;
          } while (XVar25 != L'\0');
        }
        uVar8 = uVar8 % *(ulong *)(lVar24 + 0x138);
      }
      lVar23 = (lVar23 >> 1) + -1;
      puVar15 = *(undefined8 **)(*(long *)(lVar24 + 0x130) + uVar8 * 8);
      if (puVar15 == (undefined8 *)0x0) {
        puVar26 = (undefined8 *)(*(long *)(lVar24 + 0x130) + uVar8 * 8);
      }
      else {
        do {
          puVar26 = puVar15;
          if (puVar26[1] == lVar23) {
            pXVar11 = (XMLCh *)(puVar26 + 2);
            if (pXVar11 == qualifiedName) goto LAB_00270553;
            lVar14 = 0;
            do {
              psVar3 = (short *)((long)pXVar11 + lVar14);
              if (*psVar3 == 0) {
                if (*(short *)((long)qualifiedName + lVar14) == 0) goto LAB_00270553;
                break;
              }
              psVar4 = (short *)((long)qualifiedName + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar3 == *psVar4);
          }
          puVar15 = (undefined8 *)*puVar26;
        } while ((undefined8 *)*puVar26 != (undefined8 *)0x0);
      }
      puVar15 = (undefined8 *)(**(code **)(*plVar16 + 0x20))(plVar16,lVar23 * 2 + 0x18);
      *puVar26 = puVar15;
      puVar15[1] = lVar23;
      *puVar15 = 0;
      pXVar11 = (XMLCh *)(puVar15 + 2);
      XMLString::copyString(pXVar11,qualifiedName);
    }
LAB_00270553:
    this->fName = pXVar11;
    plVar21 = (long *)(lVar24 + 0x18);
    plVar16 = (long *)(**(code **)(*(long *)(lVar24 + 0x18) + 0x130))
                                (plVar21,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar13 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar16 + 0x20))(plVar16,0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar13,(DOMNode *)this);
    this->fEntities = pDVar13;
    plVar16 = (long *)(**(code **)(*plVar21 + 0x130))
                                (plVar21,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar13 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar16 + 0x20))(plVar16,0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar13,(DOMNode *)this);
    this->fNotations = pDVar13;
    plVar16 = (long *)(**(code **)(*plVar21 + 0x130))
                                (plVar21,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar13 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar16 + 0x20))(plVar16,0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar13,(DOMNode *)this);
    this->fElements = pDVar13;
    XMLMutexLock::~XMLMutexLock(local_238);
  }
  else {
    pDVar18 = &ownerDoc[-1].super_DOMNode;
    iVar7 = (*ownerDoc[-1].super_DOMNode._vptr_DOMNode[7])(pDVar18,pubId);
    this->fPublicId = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
    iVar7 = (*pDVar18->_vptr_DOMNode[7])(pDVar18,sysId);
    this->fSystemId = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
    if (qualifiedName == (XMLCh *)0x0) {
      pp_Var20 = (_func_int **)0x0;
    }
    else {
      lVar24 = 0;
      do {
        psVar3 = (short *)((long)qualifiedName + lVar24);
        lVar24 = lVar24 + 2;
      } while (*psVar3 != 0);
      uVar8 = (ulong)(ushort)*qualifiedName;
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        XVar25 = qualifiedName[1];
        if (XVar25 != L'\0') {
          pXVar11 = qualifiedName + 2;
          do {
            uVar8 = (ulong)(ushort)XVar25 + (uVar8 >> 0x18) + uVar8 * 0x26;
            XVar25 = *pXVar11;
            pXVar11 = pXVar11 + 1;
          } while (XVar25 != L'\0');
        }
        uVar8 = uVar8 % (ulong)ownerDoc[9].super_DOMNode._vptr_DOMNode;
      }
      p_Var27 = (_func_int *)((lVar24 >> 1) + -1);
      pp_Var22 = ownerDoc[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
      pp_Var20 = (_func_int **)pp_Var22[uVar8];
      if (pp_Var20 == (_func_int **)0x0) {
        pp_Var22 = pp_Var22 + uVar8;
      }
      else {
        do {
          pp_Var22 = pp_Var20;
          if (pp_Var22[1] == p_Var27) {
            pp_Var20 = pp_Var22 + 2;
            if (pp_Var20 == (_func_int **)qualifiedName) goto LAB_00270401;
            lVar24 = 0;
            do {
              pcVar2 = (code *)((long)pp_Var20 + lVar24);
              if (*(short *)pcVar2 == 0) {
                if (*(short *)((long)qualifiedName + lVar24) == 0) goto LAB_00270401;
                break;
              }
              psVar3 = (short *)((long)qualifiedName + lVar24);
              lVar24 = lVar24 + 2;
            } while (*(short *)pcVar2 == *psVar3);
          }
          pp_Var20 = (_func_int **)*pp_Var22;
        } while ((_func_int **)*pp_Var22 != (_func_int **)0x0);
      }
      iVar7 = (*pDVar18->_vptr_DOMNode[4])(pDVar18,(long)p_Var27 * 2 + 0x18);
      p_Var12 = (_func_int *)CONCAT44(extraout_var_02,iVar7);
      *pp_Var22 = p_Var12;
      *(_func_int **)(p_Var12 + 8) = p_Var27;
      *(undefined8 *)p_Var12 = 0;
      pp_Var20 = (_func_int **)(p_Var12 + 0x10);
      XMLString::copyString((XMLCh *)pp_Var20,qualifiedName);
    }
LAB_00270401:
    this->fName = (XMLCh *)pp_Var20;
    iVar7 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar13 = (DOMNamedNodeMapImpl *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x20))
                        ((long *)CONCAT44(extraout_var_03,iVar7),0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar13,(DOMNode *)this);
    this->fEntities = pDVar13;
    iVar7 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar13 = (DOMNamedNodeMapImpl *)
              (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x20))
                        ((long *)CONCAT44(extraout_var_04,iVar7),0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar13,(DOMNode *)this);
    this->fNotations = pDVar13;
    iVar7 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    pDVar13 = (DOMNamedNodeMapImpl *)
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x20))
                        ((long *)CONCAT44(extraout_var_05,iVar7),0x618);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar13,(DOMNode *)this);
    this->fElements = pDVar13;
  }
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *qualifiedName,
                                   const XMLCh *pubId,
                                   const XMLCh *sysId,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    else if (index > 0)
    {
        // we have to make sure the qualifiedName has correct prefix and localName
        // although we don't really to store them separately
        XMLCh* newName;
        XMLCh temp[256];
        if (index >= 255)
            newName = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
            (
                (XMLString::stringLen(qualifiedName)+1) * sizeof(XMLCh)
            );//new XMLCh[XMLString::stringLen(qualifiedName)+1];
        else
            newName = temp;

        XMLString::copyNString(newName, qualifiedName, index);
        newName[index] = chNull;

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (ownerDoc) {
            if (!((DOMDocumentImpl*)ownerDoc)->isXMLName(newName) || !((DOMDocumentImpl*)ownerDoc)->isXMLName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }
        else {
            // document is not there yet, so assume XML 1.0
            if (!XMLChar1_0::isValidName(newName) || !XMLChar1_0::isValidName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }

        if (index >= 255)
            XMLPlatformUtils::fgMemoryManager->deallocate(newName);//delete[] newName;
    }

    if (ownerDoc)
    {
        DOMDocumentImpl *docImpl = (DOMDocumentImpl *)ownerDoc;
        fPublicId = docImpl->cloneString(pubId);
        fSystemId = docImpl->cloneString(sysId);
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(qualifiedName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fPublicId = ((DOMDocumentImpl*) doc)->cloneString(pubId);
        fSystemId = ((DOMDocumentImpl*) doc)->cloneString(sysId);
        fName = ((DOMDocumentImpl*) doc)->getPooledString(qualifiedName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}